

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O1

void RigidBodyDynamics::InverseDynamicsConstraintsRelaxed
               (Model *model,VectorNd *Q,VectorNd *QDot,VectorNd *QDDotControls,ConstraintSet *CS,
               VectorNd *QDDotOutput,VectorNd *TauOutput,bool update_kinematics,
               vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *f_ext)

{
  ConstraintSet *pCVar1;
  EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *matrix;
  ConstraintSet *pCVar2;
  double **ppdVar3;
  undefined8 *puVar4;
  double *pdVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  RhsNested pMVar9;
  Index IVar10;
  double dVar11;
  LhsNested pMVar12;
  undefined1 auVar13 [8];
  ActualDstType actualDst;
  RhsNested pMVar14;
  non_const_type pMVar15;
  ulong uVar16;
  long lVar17;
  RhsNested pMVar18;
  ConstraintSet *pCVar19;
  non_const_type pMVar20;
  long lVar21;
  ulong uVar22;
  ConstraintSet *pCVar23;
  Index inner;
  ActualDstType actualDst_4;
  int iVar24;
  non_const_type pMVar25;
  ActualDstType actualDst_1;
  ActualDstType actualDst_7;
  ActualDstType actualDst_2;
  ActualDstType actualDst_6;
  type tmp;
  XprType local_148;
  ConstraintSet *local_130;
  ConstraintSet *local_118;
  ConstraintSet *local_110;
  ulong local_108;
  ConstraintSet *local_100;
  ConstraintSet *local_f8;
  ConstraintSet *local_f0;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_e8;
  undefined1 local_d8 [8];
  undefined1 local_d0 [48];
  RhsNested local_a0;
  ConstraintSet *local_98;
  ConstraintSet *local_90;
  ConstraintSet *local_80;
  ConstraintSet *local_78;
  ConstraintSet *local_70;
  RhsNested local_68;
  ConstraintSet *local_60;
  ConstraintSet *local_58;
  ConstraintSet *local_50;
  ConstraintSet *local_48;
  RhsNested local_40;
  Scalar local_38;
  
  lVar17 = (TauOutput->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_rows;
  local_68 = (RhsNested)QDDotControls;
  local_40 = (RhsNested)QDDotOutput;
  if (0 < lVar17) {
    memset((TauOutput->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data,0,lVar17 << 3);
  }
  CalcConstrainedSystemVariables(model,Q,QDot,QDDotControls,CS,update_kinematics,f_ext);
  pCVar19 = CS + 0x160;
  local_80 = *(ConstraintSet **)(CS + 0x168);
  local_100 = (ConstraintSet *)(*(long *)(CS + 0x28) - *(long *)(CS + 0x20) >> 5);
  pCVar23 = CS + 0x1e8;
  local_d0._0_8_ = *(undefined8 *)(CS + 0x1f0);
  local_d0._8_8_ = *(undefined8 *)(CS + 0x1f8);
  uVar22 = *(ulong *)(CS + 0x1f0);
  local_108 = (long)local_80 - uVar22;
  local_d0._16_8_ = (void *)0x4059000000000000;
  pCVar1 = CS + 0x218;
  local_d0._24_8_ = pCVar23;
  local_d0._40_8_ = pCVar19;
  local_a0.m_matrix = (non_const_type)pCVar23;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)pCVar1,
             (Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
              *)local_d8,(assign_op<double,_double> *)&local_148,(type)0x0);
  local_d8 = (undefined1  [8])pCVar1;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Inverse<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,__1,__1,_0,__1,__1> *)(CS + 0x230),(SrcXprType *)local_d8,
        (assign_op<double,_double> *)&local_148);
  local_d0._8_8_ = CS + 0x178;
  local_78 = CS + 0x248;
  local_d8 = (undefined1  [8])(CS + 0x230);
  local_d0._0_8_ = pCVar23;
  local_60 = (ConstraintSet *)local_d0._8_8_;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Matrix<double,_1,1,0,_1,1>,0>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_78,
             (Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
              *)local_d8,(assign_op<double,_double> *)&local_148,(type)0x0);
  local_f0 = CS + 0x278;
  lVar17 = *(long *)(CS + 0x278);
  local_148.m_lhs.m_lhs = (LhsNested)pCVar23;
  local_148.m_lhs.m_rhs = (RhsNested)pCVar19;
  local_148.m_rhs.m_matrix = (non_const_type)pCVar23;
  local_130 = pCVar1;
  local_118 = pCVar19;
  local_110 = pCVar23;
  local_70 = pCVar1;
  Eigen::internal::
  product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_0>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  ::product_evaluator((product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                       *)local_d0,&local_148);
  local_d0._40_8_ = *(undefined8 *)local_130;
  local_a0.m_matrix = *(non_const_type *)(local_130 + 8);
  pMVar25 = (non_const_type)(uVar22 & 0xffffffff);
  if (pMVar25 != (non_const_type)0x0) {
    lVar21 = *(long *)(CS + 0x280);
    pMVar15 = (non_const_type)0x0;
    pMVar14 = (RhsNested)local_d0._40_8_;
    pCVar19 = (ConstraintSet *)local_d0._0_8_;
    do {
      pMVar20 = (non_const_type)0x0;
      pCVar23 = pCVar19;
      do {
        *(double *)(lVar17 + (long)pMVar20 * 8) =
             *(double *)pCVar23 +
             *(double *)
              ((long)&(pMVar14->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_data + (long)pMVar20 * 8);
        pMVar20 = (non_const_type)
                  ((long)&(pMVar20->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          ).m_storage.m_data + 1);
        pCVar23 = pCVar23 + local_d0._8_8_ * 8;
      } while (pMVar25 != pMVar20);
      pMVar15 = (non_const_type)
                ((long)&(pMVar15->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                        m_storage.m_data + 1);
      pMVar14 = (RhsNested)
                ((long)&(pMVar14->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                        m_storage.m_data + (long)local_a0.m_matrix * 8);
      pCVar19 = pCVar19 + 8;
      lVar17 = lVar17 + lVar21 * 8;
    } while (pMVar15 != pMVar25);
  }
  free((void *)local_d0._16_8_);
  pCVar19 = local_118;
  local_148.m_rhs.m_matrix = (non_const_type)(CS + 0x200);
  local_148.m_lhs.m_lhs = (LhsNested)local_110;
  local_148.m_lhs.m_rhs = (RhsNested)local_118;
  pMVar18 = (RhsNested)(uVar22 & 0xffffffff);
  pMVar20 = (non_const_type)(local_108 & 0xffffffff);
  local_d0._40_8_ = *(undefined8 *)(CS + 0x280);
  local_d8 = (undefined1  [8])(local_d0._40_8_ * (long)pMVar18 * 8 + *(long *)(CS + 0x278));
  local_d0._16_8_ = local_f0;
  local_d0._24_8_ = (RhsNested)0x0;
  local_f8 = (ConstraintSet *)local_148.m_rhs.m_matrix;
  local_d0._0_8_ = pMVar25;
  local_d0._8_8_ = pMVar20;
  local_d0._32_8_ = pMVar18;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>,Eigen::internal::assign_op<double,double>>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_d8,&local_148,
             (assign_op<double,_double> *)&local_58,(type)0x0);
  local_148.m_lhs.m_lhs = (LhsNested)local_f8;
  local_148.m_lhs.m_rhs = (RhsNested)pCVar19;
  local_148.m_rhs.m_matrix = (non_const_type)local_110;
  lVar17 = (long)pMVar18 * 8;
  local_d8 = (undefined1  [8])(*(long *)(CS + 0x278) + lVar17);
  local_d0._40_8_ = *(undefined8 *)(CS + 0x280);
  local_d0._16_8_ = local_f0;
  local_d0._32_8_ = (non_const_type)0x0;
  local_108 = lVar17;
  local_d0._0_8_ = pMVar20;
  local_d0._8_8_ = pMVar25;
  local_d0._24_8_ = pMVar18;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>,Eigen::internal::assign_op<double,double>>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_d8,&local_148,
             (assign_op<double,_double> *)&local_58,(type)0x0);
  local_148.m_lhs.m_lhs = (LhsNested)local_f8;
  local_148.m_lhs.m_rhs = (RhsNested)local_118;
  local_148.m_rhs.m_matrix = (non_const_type)local_f8;
  local_d0._40_8_ = *(undefined8 *)(CS + 0x280);
  local_d8 = (undefined1  [8])(*(long *)(CS + 0x278) + lVar17 + local_d0._40_8_ * (long)pMVar18 * 8)
  ;
  local_d0._16_8_ = local_f0;
  local_d0._0_8_ = pMVar20;
  local_d0._8_8_ = pMVar20;
  local_d0._24_8_ = pMVar18;
  local_d0._32_8_ = pMVar18;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>,Eigen::internal::assign_op<double,double>>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_d8,&local_148,
             (assign_op<double,_double> *)&local_58,(type)0x0);
  local_148.m_lhs.m_rhs = (RhsNested)(CS + 0x198);
  local_148.m_lhs.m_lhs = (LhsNested)local_110;
  matrix = (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(CS + 0x2f0);
  pMVar15 = (non_const_type)((ulong)local_100 & 0xffffffff);
  local_d8 = *(undefined1 (*) [8])(CS + 0x2f0);
  local_d0._40_8_ = *(undefined8 *)(CS + 0x2f8);
  local_d0._24_8_ = (RhsNested)0x0;
  local_d0._32_8_ = (non_const_type)0x0;
  local_118 = (ConstraintSet *)local_148.m_lhs.m_rhs;
  local_d0._0_8_ = pMVar25;
  local_d0._8_8_ = pMVar15;
  local_d0._16_8_ = matrix;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>,Eigen::internal::assign_op<double,double>>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_d8,
             (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
              *)&local_148,(assign_op<double,_double> *)&local_58,(type)0x0);
  local_148.m_lhs.m_lhs = (LhsNested)local_f8;
  local_148.m_lhs.m_rhs = (RhsNested)local_118;
  local_d8 = (undefined1  [8])(local_108 + *(long *)(CS + 0x2f0));
  local_d0._40_8_ = *(undefined8 *)(CS + 0x2f8);
  local_d0._32_8_ = (non_const_type)0x0;
  local_d0._0_8_ = pMVar20;
  local_d0._8_8_ = pMVar15;
  local_d0._16_8_ = matrix;
  local_d0._24_8_ = pMVar18;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>,Eigen::internal::assign_op<double,double>>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_d8,
             (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
              *)&local_148,(assign_op<double,_double> *)&local_58,(type)0x0);
  Eigen::HouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  compute<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)(CS + 0x380),matrix);
  local_d0._0_8_ = CS + 0x398;
  local_d0._8_8_ = local_d0._8_8_ & 0xffffffffffffff00;
  local_d0._16_8_ = *(double *)(CS + 0x388);
  if ((long)*(double *)(CS + 0x390) < (long)*(double *)(CS + 0x388)) {
    local_d0._16_8_ = *(double *)(CS + 0x390);
  }
  local_d0._24_8_ = (RhsNested)0x0;
  pCVar19 = CS + 0x458;
  local_d8 = (undefined1  [8])(CS + 0x380);
  Eigen::
  HouseholderSequence<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,1>::
  evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((HouseholderSequence<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,1>
              *)local_d8,(Matrix<double,__1,__1,_0,__1,__1> *)pCVar19);
  local_d8 = (undefined1  [8])pCVar19;
  local_d0._0_8_ = matrix;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)(CS + 0x4b8),
             (Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
              *)local_d8,(assign_op<double,_double> *)&local_148,(type)0x0);
  local_d8 = *(undefined1 (*) [8])(CS + 0x4b8);
  local_d0._40_8_ = *(undefined8 *)(CS + 0x4c0);
  local_d0._24_8_ = (RhsNested)0x0;
  local_d0._32_8_ = (non_const_type)0x0;
  local_118 = CS + 0x348;
  local_d0._0_8_ = pMVar15;
  local_d0._8_8_ = pMVar15;
  local_d0._16_8_ = CS + 0x4b8;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)local_118,
             (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_d8,
             (assign_op<double,_double> *)&local_148);
  iVar24 = (int)local_80;
  local_108 = (ulong)local_80 & 0xffffffff;
  local_d8 = *(undefined1 (*) [8])(CS + 0x458);
  local_d0._40_8_ = *(undefined8 *)(CS + 0x460);
  local_d0._24_8_ = (RhsNested)0x0;
  local_d0._32_8_ = (non_const_type)0x0;
  pCVar23 = CS + 0x488;
  local_d0._0_8_ = local_108;
  local_d0._8_8_ = pMVar15;
  local_d0._16_8_ = pCVar19;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)pCVar23,
             (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_d8,
             (assign_op<double,_double> *)&local_148);
  local_d0._8_8_ = ZEXT48((uint)(iVar24 - (int)local_100));
  local_d0._40_8_ = *(undefined8 *)(CS + 0x460);
  local_d8 = (undefined1  [8])(local_d0._40_8_ * (long)pMVar15 * 8 + *(long *)(CS + 0x458));
  local_d0._0_8_ = local_108;
  local_d0._24_8_ = (RhsNested)0x0;
  pCVar1 = CS + 0x4a0;
  local_d0._16_8_ = pCVar19;
  local_d0._32_8_ = pMVar15;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)pCVar1,
             (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_d8,
             (assign_op<double,_double> *)&local_148);
  local_d8 = (undefined1  [8])local_110;
  local_d0._0_8_ = local_60;
  local_d0._8_8_ = local_70;
  local_d0._16_8_ = local_110;
  local_d0._24_8_ = local_68;
  local_d0._32_8_ = local_110;
  local_d0._40_8_ = local_78;
  local_148.m_lhs.m_lhs = (LhsNested)0x0;
  local_148.m_lhs.m_rhs = (RhsNested)0x0;
  Eigen::internal::
  assignment_from_xpr_op_product<Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,0>,Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::Matrix<double,-1,1,0,-1,1>,0>const>,0>,0>,Eigen::internal::assign_op<double,double>,Eigen::internal::sub_assign_op<double,double>>
  ::
  run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>,0>,0>const>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_148,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_0>,_0>_>
              *)local_d8,(assign_op<double,_double> *)&local_58);
  pMVar12 = local_148.m_lhs.m_lhs;
  if (*(RhsNested *)(CS + 0x260) != local_148.m_lhs.m_rhs) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(CS + 600),
               (Index)local_148.m_lhs.m_rhs,1);
  }
  lVar17 = *(long *)(CS + 600);
  uVar22 = *(ulong *)(CS + 0x260);
  uVar16 = uVar22 - ((long)uVar22 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar22) {
    lVar21 = 0;
    do {
      ppdVar3 = &(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_data + lVar21;
      IVar10 = (Index)ppdVar3[1];
      puVar4 = (undefined8 *)(lVar17 + lVar21 * 8);
      *puVar4 = *ppdVar3;
      puVar4[1] = IVar10;
      lVar21 = lVar21 + 2;
    } while (lVar21 < (long)uVar16);
  }
  if ((long)uVar16 < (long)uVar22) {
    do {
      *(double **)(lVar17 + uVar16 * 8) =
           (&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data)[uVar16];
      uVar16 = uVar16 + 1;
    } while (uVar22 != uVar16);
  }
  local_80 = CS + 600;
  free(local_148.m_lhs.m_lhs);
  local_148.m_lhs.m_lhs = (LhsNested)local_f8;
  local_148.m_lhs.m_rhs = (RhsNested)local_60;
  local_100 = CS + 0x268;
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((Matrix<double,_1,1,0,_1,1> *)local_d8,
             (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
              *)&local_148);
  auVar13 = local_d8;
  if (*(ConstraintSet **)(CS + 0x270) != (ConstraintSet *)local_d0._0_8_) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_100,local_d0._0_8_,
               1);
  }
  lVar17 = *(long *)(CS + 0x268);
  uVar22 = *(ulong *)(CS + 0x270);
  uVar16 = uVar22 - ((long)uVar22 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar22) {
    lVar21 = 0;
    do {
      ppdVar3 = &(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)auVar13)->m_storage
                 ).m_data + lVar21;
      dVar11 = (double)ppdVar3[1];
      pdVar5 = (double *)(lVar17 + lVar21 * 8);
      *pdVar5 = (double)*ppdVar3;
      pdVar5[1] = dVar11;
      lVar21 = lVar21 + 2;
    } while (lVar21 < (long)uVar16);
  }
  if ((long)uVar16 < (long)uVar22) {
    do {
      *(double **)(lVar17 + uVar16 * 8) =
           (&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)auVar13)->m_storage).
             m_data)[uVar16];
      uVar16 = uVar16 + 1;
    } while (uVar22 != uVar16);
  }
  free((void *)local_d8);
  lVar17 = *(long *)(CS + 0x1f0);
  if (0 < lVar17) {
    lVar21 = *(long *)(CS + 600);
    lVar7 = *(long *)(CS + 0x338);
    uVar22 = 0;
    do {
      *(undefined8 *)(lVar7 + uVar22 * 8) = *(undefined8 *)(lVar21 + uVar22 * 8);
      uVar22 = uVar22 + 1;
    } while ((long)(uVar22 & 0xffffffff) < lVar17);
  }
  lVar21 = *(long *)(CS + 0x208);
  if (0 < lVar21) {
    lVar7 = *(long *)(CS + 0x268);
    lVar8 = *(long *)(CS + 0x338);
    uVar22 = 0;
    do {
      *(undefined8 *)(lVar8 + (ulong)(uint)((int)lVar17 + (int)uVar22) * 8) =
           *(undefined8 *)(lVar7 + uVar22 * 8);
      uVar22 = uVar22 + 1;
    } while ((long)(uVar22 & 0xffffffff) < lVar21);
  }
  local_148.m_lhs.m_lhs = (LhsNested)local_118;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_d8,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&local_148);
  pCVar19 = CS + 0x360;
  SolveLinearSystem((MatrixNd *)local_d8,(VectorNd *)(CS + 0x188),(VectorNd *)pCVar19,
                    *(LinearSolver *)CS);
  free((void *)local_d8);
  pCVar2 = local_f0;
  local_50 = local_f0;
  local_58 = pCVar1;
  local_48 = pCVar1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_148,
             (DenseBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)&local_58);
  local_d0._8_8_ = pCVar2;
  local_e8.m_storage.m_data = (double *)0x0;
  local_e8.m_storage.m_rows = 0;
  local_d8 = (undefined1  [8])pCVar1;
  local_d0._24_8_ = pCVar23;
  local_d0._32_8_ = pCVar19;
  local_d0._40_8_ = CS + 0x338;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_e8,*(Index *)(CS + 0x4b0),1);
  lVar17 = (((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_d8)->m_storage).
           m_cols;
  if (local_e8.m_storage.m_rows != lVar17) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_e8,lVar17,1);
  }
  if (0 < local_e8.m_storage.m_rows) {
    memset(local_e8.m_storage.m_data,0,local_e8.m_storage.m_rows << 3);
  }
  local_38 = 1.0;
  Eigen::internal::
  generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>,Eigen::Matrix<double,-1,1,0,-1,1>,0>const,Eigen::Matrix<double,-1,1,0,-1,1>const>,Eigen::DenseShape,Eigen::DenseShape,7>
  ::scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_e8,
             (Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_d8,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)local_d0,&local_38);
  pCVar2 = CS + 0x370;
  SolveLinearSystem((MatrixNd *)&local_148,(VectorNd *)&local_e8,(VectorNd *)pCVar2,
                    *(LinearSolver *)CS);
  free(local_e8.m_storage.m_data);
  free(local_148.m_lhs.m_lhs);
  local_d0._16_8_ = local_f0;
  local_a0.m_matrix = (non_const_type)local_f0;
  local_148.m_lhs.m_lhs = (LhsNested)0x0;
  local_148.m_lhs.m_rhs = (RhsNested)0x0;
  local_d8 = (undefined1  [8])pCVar23;
  local_d0._8_8_ = CS + 0x338;
  local_d0._24_8_ = pCVar23;
  local_d0._32_8_ = pCVar19;
  local_98 = pCVar1;
  local_90 = pCVar2;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_148,
             *(Index *)(CS + 0x498),1);
  pMVar9 = (RhsNested)
           (((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_d8)->m_storage).
           m_cols;
  if (local_148.m_lhs.m_rhs != pMVar9) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_148,(Index)pMVar9,
               1);
  }
  if (0 < (long)local_148.m_lhs.m_rhs) {
    memset(local_148.m_lhs.m_lhs,0,(long)local_148.m_lhs.m_rhs << 3);
  }
  local_58 = (ConstraintSet *)0x3ff0000000000000;
  Eigen::internal::
  generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>,Eigen::Matrix<double,-1,1,0,-1,1>,0>const>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>,Eigen::Matrix<double,-1,1,0,-1,1>,0>const>,Eigen::DenseShape,Eigen::DenseShape,7>
  ::scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_148,
             (Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_d8,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)local_d0,(Scalar *)&local_58);
  SolveLinearSystem((MatrixNd *)local_118,(VectorNd *)&local_148,(VectorNd *)(CS + 0x130),
                    *(LinearSolver *)CS);
  free(local_148.m_lhs.m_lhs);
  local_148.m_lhs.m_lhs = (LhsNested)0x0;
  local_148.m_lhs.m_rhs = (RhsNested)0x0;
  local_d8 = (undefined1  [8])pCVar23;
  local_d0._0_8_ = pCVar19;
  local_d0._8_8_ = pCVar1;
  local_d0._16_8_ = pCVar2;
  Eigen::internal::
  assignment_from_xpr_op_product<Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,0>,Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,0>,Eigen::internal::assign_op<double,double>,Eigen::internal::add_assign_op<double,double>>
  ::
  run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_148,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)local_d8,(assign_op<double,_double> *)&local_58);
  pMVar9 = local_40;
  pCVar19 = local_80;
  pMVar12 = local_148.m_lhs.m_lhs;
  if ((RhsNested)
      (local_40->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
      != local_148.m_lhs.m_rhs) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_40,
               (Index)local_148.m_lhs.m_rhs,1);
  }
  pdVar5 = (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_data;
  uVar22 = (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_rows;
  uVar16 = uVar22 - ((long)uVar22 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar22) {
    lVar17 = 0;
    do {
      ppdVar3 = &(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_data + lVar17;
      dVar11 = (double)ppdVar3[1];
      pdVar6 = pdVar5 + lVar17;
      *pdVar6 = (double)*ppdVar3;
      pdVar6[1] = dVar11;
      lVar17 = lVar17 + 2;
    } while (lVar17 < (long)uVar16);
  }
  if ((long)uVar16 < (long)uVar22) {
    do {
      pdVar5[uVar16] =
           (double)(&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_data)[uVar16];
      uVar16 = uVar16 + 1;
    } while (uVar22 != uVar16);
  }
  free(local_148.m_lhs.m_lhs);
  lVar17 = *(long *)(CS + 0x1f0);
  if (0 < lVar17) {
    pdVar5 = (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
    lVar21 = *(long *)pCVar19;
    uVar22 = 0;
    do {
      *(double *)(lVar21 + uVar22 * 8) = pdVar5[uVar22];
      uVar22 = uVar22 + 1;
    } while ((long)(uVar22 & 0xffffffff) < lVar17);
  }
  lVar21 = *(long *)(CS + 0x208);
  if (0 < lVar21) {
    pdVar5 = (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
    lVar7 = *(long *)local_100;
    uVar22 = 0;
    do {
      *(double *)(lVar7 + uVar22 * 8) = pdVar5[(uint)((int)lVar17 + (int)uVar22)];
      uVar22 = uVar22 + 1;
    } while ((long)(uVar22 & 0xffffffff) < lVar21);
  }
  local_d8 = (undefined1  [8])local_110;
  local_d0._0_8_ = pCVar19;
  local_d0._8_8_ = local_f8;
  local_d0._16_8_ = local_100;
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>>
            ((Matrix<double,_1,1,0,_1,1> *)&local_148,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)local_d8);
  pMVar12 = local_148.m_lhs.m_lhs;
  if ((RhsNested)
      (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows !=
      local_148.m_lhs.m_rhs) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)pMVar9,
               (Index)local_148.m_lhs.m_rhs,1);
  }
  pdVar5 = (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_data;
  uVar22 = (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_rows;
  uVar16 = uVar22 - ((long)uVar22 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar22) {
    lVar17 = 0;
    do {
      ppdVar3 = &(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_data + lVar17;
      dVar11 = (double)ppdVar3[1];
      pdVar6 = pdVar5 + lVar17;
      *pdVar6 = (double)*ppdVar3;
      pdVar6[1] = dVar11;
      lVar17 = lVar17 + 2;
    } while (lVar17 < (long)uVar16);
  }
  if ((long)uVar16 < (long)uVar22) {
    do {
      pdVar5[uVar16] =
           (double)(&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_data)[uVar16];
      uVar16 = uVar16 + 1;
    } while (uVar22 != uVar16);
  }
  free(local_148.m_lhs.m_lhs);
  local_d8 = (undefined1  [8])local_110;
  local_d0._0_8_ = local_70;
  local_d0._8_8_ = local_110;
  local_d0._24_8_ = local_68;
  local_d0._32_8_ = local_110;
  local_d0._40_8_ = local_78;
  local_98 = (ConstraintSet *)pMVar9;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,0>,Eigen::internal::assign_op<double,double>>
            (TauOutput,
             (Product<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>
              *)local_d8,(assign_op<double,_double> *)&local_148,(type)0x0);
  return;
}

Assistant:

RBDL_DLLAPI
void InverseDynamicsConstraintsRelaxed(
  Model &model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  const Math::VectorNd &QDDotControls,
  ConstraintSet &CS,
  Math::VectorNd &QDDotOutput,
  Math::VectorNd &TauOutput,
  bool update_kinematics,
  std::vector<Math::SpatialVector> *f_ext)
{
  LOG << "-------- " << __func__ << " --------" << std::endl;

  //Check that the input vectors and matricies are sized appropriately
  assert(Q.size()               == model.q_size);
  assert(QDot.size()            == model.qdot_size);
  assert(QDDotControls.size()    == model.dof_count);
  assert(CS.S.cols()            == model.dof_count);
  assert(CS.W.rows()            == CS.W.cols());
  assert(CS.W.rows()            == CS.S.rows());
  assert(QDDotOutput.size()     == model.dof_count);

  TauOutput.setZero();
  CalcConstrainedSystemVariables(model,Q,QDot,TauOutput,CS,update_kinematics,
                                f_ext);

  unsigned int n  = unsigned(    CS.H.rows());
  unsigned int nc = unsigned( CS.name.size());
  unsigned int na = unsigned(    CS.S.rows());
  unsigned int nu = n-na;

  //MM 2020/5/29:
  //  The updates I made to Henning's original formulation have
  //  almost certainly made the sensitivity of the resulting qdd
  //  w.r.t. the controls poorly scaled. At least this is a suspicion
  //  of mine looking at how an OCP is behaving when using this operator.
  //  Reverting to the original formulation.
  //MM: Update to Henning's formulation s.t. the relaxed IDC operator will
  //    more closely satisfy QDDotControls if it is possible.
  //double diag = 0.;//100.*CS.H.maxCoeff();
  //double diagInv = 0.;
  //for(unsigned int i=0; i<CS.H.rows(); ++i) {
  //  for(unsigned int j=0; j<CS.H.cols(); ++j) {
  //    if(fabs(CS.H(i,j)) > diag) {
  //      diag = fabs(CS.H(i,j));
  //    }
  //  }
  //}
  //diag = diag*100.;
  //diagInv = 1.0/diag;
  //for(unsigned int i=0; i<CS.W.rows(); ++i) {
  //  CS.W(i,i)    = diag;
  //  CS.Winv(i,i) = diagInv;
  //}

  CS.W = 100.0*CS.S*CS.H*CS.S.transpose();
  CS.Winv = CS.W.inverse();
  CS.WinvSC = CS.Winv * CS.S * CS.C;

  //CS.W = CS.S*CS.H*CS.S.transpose();

  CS.F.block(  0,  0, na, na) = CS.S*CS.H*CS.S.transpose() + CS.W;
  CS.F.block(  0, na, na, nu) = CS.S*CS.H*CS.P.transpose();
  CS.F.block( na,  0, nu, na) = CS.P*CS.H*CS.S.transpose();
  CS.F.block( na, na, nu, nu) = CS.P*CS.H*CS.P.transpose();

  CS.GT.block(  0, 0,na, nc) = CS.S*(CS.G.transpose());
  CS.GT.block( na, 0,nu, nc) = CS.P*(CS.G.transpose());

  CS.GT_qr.compute (CS.GT);
  CS.GT_qr.householderQ().evalTo (CS.GT_qr_Q);

  //GT = [Y  Z] * [ R ]
  //              [ 0 ]

  CS.R  = CS.GT_qr_Q.transpose()*CS.GT;
  CS.Ru = CS.R.block(0,0,nc,nc);

  CS.Y = CS.GT_qr_Q.block( 0, 0,  n, nc    );
  CS.Z = CS.GT_qr_Q.block( 0, nc, n, (n-nc));

  //MM: Update to Henning's formulation s.t. the relaxed IDC operator will
  //    exactly satisfy QDDotControls if it is possible.
  //
  //Modify QDDotControls so that SN is cancelled.
  //
  //    +SC - WS(qdd*)
  //
  // Add a term to cancel off SN
  //
  //    +SC - WS( qdd* + (S' W^-1 S)N )
  //

  CS.u = CS.S*CS.C - CS.W*(CS.S*(QDDotControls
                                 +(CS.S.transpose()*CS.WinvSC)));
  //CS.u =  CS.S*CS.C - CS.W*(CS.S*QDDotControls);
  CS.v =  CS.P*CS.C;

  for(unsigned int i=0; i<CS.S.rows(); ++i) {
    CS.g[i] = CS.u[i];
  }
  unsigned int j=CS.S.rows();
  for(unsigned int i=0; i<CS.P.rows(); ++i) {
    CS.g[j] = CS.v[i];
    ++j;
  }

  //nc x nc system
  SolveLinearSystem(CS.Ru.transpose(), CS.gamma, CS.py, CS.linear_solver);

  //(n-nc) x (n-nc) system
  SolveLinearSystem(CS.Z.transpose()*CS.F*CS.Z,
                    CS.Z.transpose()*(-CS.F*CS.Y*CS.py-CS.g),
                    CS.pz,
                    CS.linear_solver);

  //nc x nc system
  SolveLinearSystem(CS.Ru,
                    CS.Y.transpose()*(CS.g + CS.F*CS.Y*CS.py + CS.F*CS.Z*CS.pz),
                    CS.force, CS.linear_solver);

  //Eqn. 32d, the equation for qdd, is in error. Instead
  // p = Ypy + Zpz = [v,w]
  // qdd = S'v + P'w
  QDDotOutput = CS.Y*CS.py + CS.Z*CS.pz;
  for(unsigned int i=0; i<CS.S.rows(); ++i) {
    CS.u[i] = QDDotOutput[i];
  }
  j = CS.S.rows();
  for(unsigned int i=0; i<CS.P.rows(); ++i) {
    CS.v[i] = QDDotOutput[j];
    ++j;
  }

  QDDotOutput = CS.S.transpose()*CS.u
                +CS.P.transpose()*CS.v;

  TauOutput = (CS.S.transpose()*CS.W*CS.S)*(
                QDDotControls+(CS.S.transpose()*CS.WinvSC)
                -QDDotOutput);
  //TauOutput =  CS.S.transpose()*CS.W*CS.S*(QDDotControls - QDDotOutput);


}